

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O2

bool __thiscall
iDynTree::BerdyHelper::serializeDynamicVariablesComputedFromFixedBaseRNEA
          (BerdyHelper *this,JointDOFsDoubleArray *jointAccs,LinkNetExternalWrenches *netExtWrenches
          ,VectorDynSize *d)

{
  bool bVar1;
  long lVar2;
  Twist *pTVar3;
  SpatialMomentum *pSVar4;
  Wrench *this_00;
  JointDOFsDoubleArray *jointTorques;
  long lVar5;
  LinkAccArray linkProperAccs;
  LinkNetTotalWrenchesWithoutGravity linkNetWrenchesWithoutGravity;
  LinkVelArray linkVels;
  LinkInternalWrenches intWrenches;
  Wrench local_1a0;
  Vector3 baseProperAcc;
  SpatialInertia local_150 [56];
  Twist local_118 [56];
  CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_e0 [2];
  FreeFloatingGeneralizedTorques genTrqs;
  Vector3 zeroVec;
  
  iDynTree::LinkWrenches::LinkWrenches(&intWrenches,&this->m_model);
  iDynTree::FreeFloatingGeneralizedTorques::FreeFloatingGeneralizedTorques(&genTrqs,&this->m_model);
  iDynTree::LinkVelArray::LinkVelArray(&linkVels,&this->m_model);
  iDynTree::LinkAccArray::LinkAccArray(&linkProperAccs,&this->m_model);
  local_e0[0].m_xpr._0_8_ = &this->m_gravity;
  local_1a0._0_8_ = &baseProperAcc;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const>>
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_1a0,
             local_e0);
  VectorFixSize<3U>::zero(&zeroVec);
  dynamicsEstimationForwardVelAccKinematics
            (&this->m_model,&this->m_dynamicsTraversal,&baseProperAcc,&zeroVec,&zeroVec,
             &this->m_jointPos,&this->m_jointVel,jointAccs,&linkVels,&linkProperAccs);
  iDynTree::RNEADynamicPhase
            (&this->m_model,&this->m_dynamicsTraversal,&this->m_jointPos,&linkVels,&linkProperAccs,
             netExtWrenches,&intWrenches,&genTrqs);
  iDynTree::LinkWrenches::LinkWrenches(&linkNetWrenchesWithoutGravity,&this->m_model);
  lVar5 = 0;
  while( true ) {
    lVar2 = iDynTree::Model::getNrOfLinks();
    if (lVar2 <= lVar5) break;
    iDynTree::Model::getLink((long)this);
    pTVar3 = (Twist *)iDynTree::Link::getInertia();
    iDynTree::LinkAccArray::operator()(&linkProperAccs,lVar5);
    pSVar4 = (SpatialMomentum *)iDynTree::LinkVelArray::operator()(&linkVels,lVar5);
    iDynTree::SpatialInertia::operator*((SpatialInertia *)&local_1a0,(SpatialAcc *)pTVar3);
    iDynTree::SpatialInertia::operator*(local_150,pTVar3);
    iDynTree::Twist::operator*(local_118,pSVar4);
    iDynTree::Wrench::operator+((Wrench *)local_e0,&local_1a0);
    this_00 = (Wrench *)iDynTree::LinkWrenches::operator()(&linkNetWrenchesWithoutGravity,lVar5);
    iDynTree::Wrench::operator=(this_00,(Wrench *)local_e0);
    iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_e0);
    iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_118);
    iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_150);
    iDynTree::SpatialForceVector::~SpatialForceVector(&local_1a0.super_SpatialForceVector);
    lVar5 = lVar5 + 1;
  }
  jointTorques = (JointDOFsDoubleArray *)iDynTree::FreeFloatingGeneralizedTorques::jointTorques();
  bVar1 = serializeDynamicVariables
                    (this,&linkProperAccs,&linkNetWrenchesWithoutGravity,netExtWrenches,&intWrenches
                     ,jointTorques,jointAccs,d);
  iDynTree::LinkWrenches::~LinkWrenches(&linkNetWrenchesWithoutGravity);
  iDynTree::LinkAccArray::~LinkAccArray(&linkProperAccs);
  iDynTree::LinkVelArray::~LinkVelArray(&linkVels);
  iDynTree::FreeFloatingGeneralizedTorques::~FreeFloatingGeneralizedTorques(&genTrqs);
  iDynTree::LinkWrenches::~LinkWrenches(&intWrenches);
  return bVar1;
}

Assistant:

bool BerdyHelper::serializeDynamicVariablesComputedFromFixedBaseRNEA(JointDOFsDoubleArray& jointAccs,
                                                                     LinkNetExternalWrenches& netExtWrenches,
                                                                     VectorDynSize& d)
{
    assert(jointAccs.size() == this->m_model.getNrOfDOFs());
    assert(netExtWrenches.isConsistent(this->m_model));

    LinkInternalWrenches intWrenches(this->m_model);
    FreeFloatingGeneralizedTorques genTrqs(this->m_model);

    LinkVelArray linkVels(this->m_model);
    LinkAccArray linkProperAccs(this->m_model);


    Vector3 baseProperAcc;
    toEigen(baseProperAcc) = -toEigen(m_gravity);
    Vector3 zeroVec;
    zeroVec.zero();
    dynamicsEstimationForwardVelAccKinematics(m_model,m_dynamicsTraversal,
                                                        baseProperAcc,
                                                        zeroVec,
                                                        zeroVec,
                                                        m_jointPos,
                                                        m_jointVel,
                                                        jointAccs,
                                                        linkVels,
                                                        linkProperAccs);

    RNEADynamicPhase(m_model,m_dynamicsTraversal,
                     m_jointPos,linkVels,linkProperAccs,
                     netExtWrenches,intWrenches,genTrqs);

    // Generate the d vector of dynamical variables
    assert(d.size() == this->getNrOfDynamicVariables());

    // LinkNewInternalWrenches (necessary for the old-style berdy)
    LinkNetTotalWrenchesWithoutGravity linkNetWrenchesWithoutGravity(this->model());

    for(LinkIndex visitedLinkIndex = 0; visitedLinkIndex < static_cast<LinkIndex>(model().getNrOfLinks()); visitedLinkIndex++)
     {
         LinkConstPtr visitedLink = this->model().getLink(visitedLinkIndex);

         const iDynTree::SpatialInertia & I = visitedLink->getInertia();
         const iDynTree::SpatialAcc     & properAcc = linkProperAccs(visitedLinkIndex);
         const iDynTree::Twist          & v = linkVels(visitedLinkIndex);
         linkNetWrenchesWithoutGravity(visitedLinkIndex) = I*properAcc + v*(I*v);
     }

     return serializeDynamicVariables(linkProperAccs,linkNetWrenchesWithoutGravity,netExtWrenches,
                                      intWrenches,genTrqs.jointTorques(),jointAccs,d);
}